

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64_count_shift.hpp
# Opt level: O3

void __thiscall trng::lcg64_count_shift::split(lcg64_count_shift *this,uint s,uint n)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  uint i;
  long lVar4;
  result_type rVar5;
  result_type rVar6;
  ulong uVar7;
  result_type rVar8;
  result_type rVar9;
  long lVar10;
  long lVar11;
  result_type rVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  invalid_argument local_40 [16];
  
  if (s <= n) {
    std::invalid_argument::invalid_argument
              (local_40,"invalid argument for trng::lcg64_count_shift::split");
    utility::throw_this<std::invalid_argument>(local_40);
    std::invalid_argument::~invalid_argument(local_40);
  }
  if (1 < s) {
    jump(this,(ulong)n + 1);
    uVar3 = (ulong)s;
    uVar15 = s >> 1;
    if (uVar15 == 0) {
      uVar2 = 0x40;
    }
    else {
      uVar2 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar2 = uVar2 ^ 0x3f;
    }
    rVar8 = (this->P).a;
    lVar4 = 0;
    lVar16 = 0;
    rVar9 = rVar8;
    do {
      if (((uint)(1L << ((byte)lVar4 & 0x3f)) & s) != 0) {
        lVar10 = 1;
        rVar12 = rVar8;
        for (lVar11 = lVar4; lVar11 != 0; lVar11 = lVar11 + -1) {
          lVar10 = lVar10 * (rVar12 + 1);
          rVar12 = rVar12 * rVar12;
        }
        lVar16 = lVar16 * rVar9 + lVar10;
      }
      rVar9 = rVar9 * rVar9;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x41 - uVar2);
    rVar12 = lVar16 * (this->P).b;
    (this->P).b = rVar12;
    rVar9 = 1;
    uVar2 = uVar3;
    do {
      rVar5 = rVar8;
      if ((uVar2 & 1) == 0) {
        rVar5 = 1;
      }
      rVar9 = rVar9 * rVar5;
      rVar8 = rVar8 * rVar8;
      bVar1 = 1 < uVar2;
      uVar2 = uVar2 >> 1;
    } while (bVar1);
    (this->P).a = rVar9;
    uVar2 = (this->P).inc;
    if (uVar2 == 0) {
      uVar3 = 0;
    }
    else {
      uVar13 = uVar2;
      if (uVar3 >= uVar2 && uVar3 != uVar2) {
        uVar13 = uVar3;
      }
      if (uVar3 < uVar2) {
        uVar2 = uVar3;
      }
      uVar3 = 0;
      do {
        uVar7 = uVar3 + uVar13;
        if (0x1ffffffffffffffe < uVar7) {
          uVar7 = uVar7 + 0xe000000000000001;
        }
        if ((uVar2 & 1) != 0) {
          uVar3 = uVar7;
        }
        uVar7 = uVar13 * 2;
        uVar13 = uVar13 * 2 + 0xe000000000000001;
        if (uVar7 < 0x1fffffffffffffff) {
          uVar13 = uVar7;
        }
        bVar1 = 1 < uVar2;
        uVar2 = uVar2 >> 1;
      } while (bVar1);
    }
    (this->P).inc = uVar3;
    rVar8 = (this->S).r;
    lVar4 = 0;
    do {
      uVar13 = 1L << ((byte)lVar4 & 0x3f);
      lVar16 = 1;
      rVar5 = rVar9;
      uVar2 = uVar13;
      do {
        rVar6 = rVar5;
        if ((uVar2 & 1) == 0) {
          rVar6 = 1;
        }
        lVar16 = lVar16 * rVar6;
        rVar5 = rVar5 * rVar5;
        bVar1 = 1 < uVar2;
        uVar2 = uVar2 >> 1;
      } while (bVar1);
      uVar2 = uVar13 >> 1;
      if (uVar2 == 0) {
        uVar7 = 0x40;
      }
      else {
        uVar7 = 0x3f;
        if (uVar2 != 0) {
          for (; uVar2 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        uVar7 = uVar7 ^ 0x3f;
      }
      uVar2 = 0;
      lVar10 = 0;
      rVar5 = rVar9;
      do {
        if ((uVar13 >> (uVar2 & 0x3f) & 1) != 0) {
          lVar11 = 1;
          rVar6 = rVar9;
          for (uVar14 = uVar2; uVar14 != 0; uVar14 = uVar14 - 1) {
            lVar11 = lVar11 * (rVar6 + 1);
            rVar6 = rVar6 * rVar6;
          }
          lVar10 = lVar10 * rVar5 + lVar11;
        }
        rVar5 = rVar5 * rVar5;
        uVar2 = uVar2 + 1;
      } while (uVar2 != 0x41 - uVar7);
      rVar8 = lVar10 * rVar12 + rVar8 * lVar16;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x40);
    (this->S).r = rVar8;
    uVar3 = (this->S).count - uVar3;
    uVar2 = uVar3 + 0x1fffffffffffffff;
    if (uVar3 < 0xe000000000000001) {
      uVar2 = uVar3;
    }
    (this->S).count = uVar2;
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void lcg64_count_shift::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(
          std::invalid_argument("invalid argument for trng::lcg64_count_shift::split"));
#endif
    if (s > 1) {
      // LCG part
      jump(n + 1ull);
      P.b *= f(s, P.a);
      P.a = pow(P.a, s);
      // counting part
      P.inc = mult_modulo(s, P.inc);
      backward();
    }
  }